

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_pipeline(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  bool bVar1;
  uint uVar2;
  _func_int **pp_Var3;
  void *__ptr;
  Allocator *pAVar4;
  undefined4 *puVar5;
  int *piVar6;
  int _h;
  ulong uVar7;
  _func_int *p_Var8;
  long lVar9;
  undefined4 *puVar10;
  int _w;
  ulong uVar11;
  int iVar12;
  Mat local_c8;
  Option *local_80;
  Mat local_78;
  
  p_Var8 = this->_vptr_DeconvolutionDepthWise_x86[-3];
  uVar11 = (long)*(int *)(&this->field_0xd8 + (long)p_Var8) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var8);
  uVar2 = *(uint *)(&this->field_0x114 + (long)p_Var8);
  uVar7 = (long)*(int *)(&this->field_0x110 + (long)p_Var8) / (long)(int)uVar2;
  _w = (int)uVar11;
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / (long)_w;
  if ((uVar2 == *(uint *)(&this->field_0xd0 + (long)p_Var8)) &&
     ((int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
           (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var8) / (int)uVar2)) * uVar2 == uVar2))
  {
    bVar1 = opt->use_packing_layout;
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    iVar12 = 0;
    local_80 = opt;
    Mat::create(&local_c8,*(int *)(&this->field_0x194 + (long)p_Var8),4,(Allocator *)0x0);
    pp_Var3 = this->_vptr_DeconvolutionDepthWise_x86;
    p_Var8 = pp_Var3[-3];
    _h = *(int *)(&this->field_0x114 + (long)p_Var8);
    if (0 < (int)((uVar2 - (int)uVar2 % _h) * (*(int *)(&this->field_0xd0 + (long)p_Var8) / _h))) {
      lVar9 = *(long *)(&this->field_0x168 + (long)p_Var8);
      puVar10 = (undefined4 *)((long)local_c8.data + uVar11 * 4 + -4);
      do {
        if (0 < _w) {
          uVar7 = 0;
          puVar5 = puVar10;
          do {
            *puVar5 = *(undefined4 *)(lVar9 + uVar7 * 4);
            uVar7 = uVar7 + 1;
            puVar5 = puVar5 + -1;
          } while ((uVar11 & 0xffffffff) != uVar7);
          p_Var8 = pp_Var3[-3];
        }
        iVar12 = iVar12 + 1;
        _h = *(int *)(&this->field_0x114 + (long)p_Var8);
        lVar9 = lVar9 + uVar11 * 4;
        puVar10 = puVar10 + uVar11;
      } while (iVar12 < (int)((uVar2 - (int)uVar2 % _h) *
                             (*(int *)(&this->field_0xd0 + (long)p_Var8) / _h)));
    }
    if (((uVar2 & 3) == 0 & bVar1) == 0) {
      piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (&this->weight_data_tm != &local_c8) {
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (this->weight_data_tm).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            __ptr = (this->weight_data_tm).data;
            pAVar4 = (this->weight_data_tm).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(code **)(*(long *)pAVar4 + 0x18))();
            }
          }
        }
        (this->weight_data_tm).data = local_c8.data;
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        (this->weight_data_tm).refcount = piVar6;
        (this->weight_data_tm).elemsize =
             CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
        (this->weight_data_tm).elempack = local_c8.elempack;
        (this->weight_data_tm).allocator = local_c8.allocator;
        (this->weight_data_tm).dims = local_c8.dims;
        (this->weight_data_tm).w = local_c8.w;
        (this->weight_data_tm).h = local_c8.h;
        (this->weight_data_tm).d = local_c8.d;
        (this->weight_data_tm).c = local_c8.c;
        (this->weight_data_tm).cstep = local_c8.cstep;
      }
    }
    else {
      Mat::reshape(&local_78,&local_c8,_w,_h,(Allocator *)0x0);
      convert_packing(&local_78,&this->weight_data_tm,4,local_80);
      if (local_78.refcount != (int *)0x0) {
        LOCK();
        *local_78.refcount = *local_78.refcount + -1;
        UNLOCK();
        if (*local_78.refcount == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (**(code **)(*(long *)local_78.allocator + 0x18))();
          }
        }
      }
      piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_c8.allocator + 0x18))();
        }
      }
    }
  }
  else {
    create_group_ops(this,opt);
    if (opt->lightmode == true) {
      p_Var8 = this->_vptr_DeconvolutionDepthWise_x86[-3];
      piVar6 = *(int **)(&this->field_0x170 + (long)p_Var8);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (*(long **)(&this->field_0x188 + (long)p_Var8) == (long *)0x0) {
            if (*(void **)(&this->field_0x168 + (long)p_Var8) != (void *)0x0) {
              free(*(void **)(&this->field_0x168 + (long)p_Var8));
            }
          }
          else {
            (**(code **)(**(long **)(&this->field_0x188 + (long)p_Var8) + 0x18))();
          }
        }
      }
      *(undefined8 *)(&this->field_0x1a8 + (long)p_Var8) = 0;
      *(undefined8 *)(&this->field_0x174 + (long)p_Var8) = 0;
      *(undefined8 *)(&this->field_0x17c + (long)p_Var8) = 0;
      *(undefined8 *)(&this->field_0x168 + (long)p_Var8) = 0;
      *(undefined8 *)(&this->field_0x170 + (long)p_Var8) = 0;
      *(undefined8 *)(&this->field_0x190 + (long)p_Var8) = 0;
      *(undefined8 *)(&this->field_0x198 + (long)p_Var8) = 0;
      *(undefined4 *)(&this->field_0x1a0 + (long)p_Var8) = 0;
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}